

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O2

void __thiscall
RegVmLoweredInstruction::RegVmLoweredInstruction
          (RegVmLoweredInstruction *this,Allocator *allocator,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmConstant *argument)

{
  this->location = location;
  this->code = code;
  this->rA = rA;
  this->rB = rB;
  this->rC = rC;
  this->argument = argument;
  (this->preKillRegisters).allocator = allocator;
  (this->preKillRegisters).data = (this->preKillRegisters).little;
  (this->preKillRegisters).count = 0;
  (this->preKillRegisters).max = 8;
  (this->postKillRegisters).allocator = allocator;
  (this->postKillRegisters).data = (this->postKillRegisters).little;
  (this->postKillRegisters).count = 0;
  (this->postKillRegisters).max = 8;
  this->parent = (RegVmLoweredBlock *)0x0;
  this->prevSibling = (RegVmLoweredInstruction *)0x0;
  this->nextSibling = (RegVmLoweredInstruction *)0x0;
  return;
}

Assistant:

RegVmLoweredInstruction(Allocator *allocator, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmConstant *argument): location(location), code(code), rA(rA), rB(rB), rC(rC), argument(argument), preKillRegisters(allocator), postKillRegisters(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;
	}